

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereCheckIfBloomFilterIsUseful(WhereInfo *pWInfo)

{
  WhereLoop *pWVar1;
  Table *pTVar2;
  Table *pTab;
  SrcItem *pItem;
  uint reqFlags;
  WhereLoop *pLoop;
  LogEst nSearch;
  int i;
  WhereInfo *pWInfo_local;
  
  nSearch = 0;
  i = 0;
  while( true ) {
    if ((int)(uint)pWInfo->nLevel <= i) {
      return;
    }
    pWVar1 = pWInfo->a[i].pWLoop;
    pTVar2 = pWInfo->pTabList->a[pWVar1->iTab].pSTab;
    if ((pTVar2->tabFlags & 0x10) == 0) break;
    pTVar2->tabFlags = pTVar2->tabFlags | 0x100;
    if ((((0 < i) && ((pWVar1->wsFlags & 0x800001) == 0x800001)) && ((pWVar1->wsFlags & 0x300) != 0)
        ) && (pTVar2->nRowLogEst < nSearch)) {
      pWVar1->wsFlags = pWVar1->wsFlags | 0x400000;
      pWVar1->wsFlags = pWVar1->wsFlags & 0xffffffbf;
    }
    nSearch = nSearch + pWVar1->nOut;
    i = i + 1;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereCheckIfBloomFilterIsUseful(
  const WhereInfo *pWInfo
){
  int i;
  LogEst nSearch = 0;

  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_BloomFilter) );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLoop *pLoop = pWInfo->a[i].pWLoop;
    const unsigned int reqFlags = (WHERE_SELFCULL|WHERE_COLUMN_EQ);
    SrcItem *pItem = &pWInfo->pTabList->a[pLoop->iTab];
    Table *pTab = pItem->pSTab;
    if( (pTab->tabFlags & TF_HasStat1)==0 ) break;
    pTab->tabFlags |= TF_MaybeReanalyze;
    if( i>=1
     && (pLoop->wsFlags & reqFlags)==reqFlags
     /* vvvvvv--- Always the case if WHERE_COLUMN_EQ is defined */
     && ALWAYS((pLoop->wsFlags & (WHERE_IPK|WHERE_INDEXED))!=0)
    ){
      if( nSearch > pTab->nRowLogEst ){
        testcase( pItem->fg.jointype & JT_LEFT );
        pLoop->wsFlags |= WHERE_BLOOMFILTER;
        pLoop->wsFlags &= ~WHERE_IDX_ONLY;
        WHERETRACE(0xffffffff, (
           "-> use Bloom-filter on loop %c because there are ~%.1e "
           "lookups into %s which has only ~%.1e rows\n",
           pLoop->cId, (double)sqlite3LogEstToInt(nSearch), pTab->zName,
           (double)sqlite3LogEstToInt(pTab->nRowLogEst)));
      }
    }
    nSearch += pLoop->nOut;
  }
}